

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_parser.cpp
# Opt level: O1

Configuration ParseCmdArgs(int argc,char **argv,int *argc_flags_offset_out)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  int iVar5;
  byte bVar6;
  byte bVar7;
  string flag;
  allocator<char> local_65;
  uint local_64;
  uint local_60;
  uint local_5c;
  int *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  iVar5 = 1;
  local_64 = 0;
  local_60 = 0;
  local_5c = 0;
  bVar6 = 0;
  local_58 = argc_flags_offset_out;
  do {
    if (argc <= iVar5) break;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,argv[iVar5],&local_65);
    iVar3 = std::__cxx11::string::compare((char *)local_50);
    if (iVar3 == 0) {
LAB_00104cb2:
      bVar6 = 1;
LAB_00104cd5:
      iVar5 = iVar5 + 1;
      bVar1 = true;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)local_50);
      if (iVar3 == 0) goto LAB_00104cb2;
      uVar4 = std::__cxx11::string::compare((char *)local_50);
      if ((int)uVar4 == 0) {
LAB_00104cb9:
        local_5c = (uint)CONCAT71((int7)((ulong)uVar4 >> 8),1);
        goto LAB_00104cd5;
      }
      uVar4 = std::__cxx11::string::compare((char *)local_50);
      if ((int)uVar4 == 0) goto LAB_00104cb9;
      uVar4 = std::__cxx11::string::compare((char *)local_50);
      if ((int)uVar4 == 0) {
LAB_00104cc3:
        local_60 = (uint)CONCAT71((int7)((ulong)uVar4 >> 8),1);
        goto LAB_00104cd5;
      }
      uVar4 = std::__cxx11::string::compare((char *)local_50);
      if ((int)uVar4 == 0) goto LAB_00104cc3;
      uVar4 = std::__cxx11::string::compare((char *)local_50);
      if ((int)uVar4 == 0) {
LAB_00104ccd:
        local_64 = (uint)CONCAT71((int7)((ulong)uVar4 >> 8),1);
        goto LAB_00104cd5;
      }
      uVar4 = std::__cxx11::string::compare((char *)local_50);
      if ((int)uVar4 == 0) goto LAB_00104ccd;
      bVar1 = false;
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  } while (bVar1);
  uVar2 = local_64;
  bVar7 = 1;
  if ((local_64 & 1) != 0) {
    bVar7 = bVar6;
  }
  if (iVar5 != argc) {
    bVar7 = bVar6;
  }
  if (bVar7 != 0) {
    PrintUsage();
  }
  *local_58 = iVar5;
  return (Configuration)
         ((uint)bVar7 | (local_5c & 0xff) << 8 | (local_60 & 0xff) << 0x10 | uVar2 << 0x18);
}

Assistant:

Configuration ParseCmdArgs(int argc, char **argv, int &argc_flags_offset_out) {
    //executable name should be skipped
    int offset = 1;
    
    Configuration config;
    
    while (offset < argc) {
        std::string flag(argv[offset]);
        if (flag == "--help" || flag == "-h") {
            config.printUsage = true;
            ++offset;
            continue;
        }
        if (flag == "--silent" || flag == "-s") {
            config.silent = true;
            ++offset;
            continue;
        }
        if (flag == "--perf" || flag == "-p") {
            config.measurePerformance = true;
            ++offset;
            continue;
        }
        if (flag == "--interactive" || flag == "-i") {
            config.interactive = true;
            ++offset;
            continue;
        }
        break;
    }
    //usage should be printed when we don't know what to process
    if (argc == offset && !config.interactive) {
        config.printUsage = true;
    }
    if (config.printUsage) PrintUsage();
    
    argc_flags_offset_out = offset;
    return config;
}